

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

TPZFlopCounter __thiscall
TPZMatrix<TPZFlopCounter>::ConditionNumber
          (TPZMatrix<TPZFlopCounter> *this,int p,int64_t numiter,REAL tol)

{
  TPZFlopCounter TVar1;
  TPZFlopCounter TVar2;
  int iVar3;
  TPZFMatrix<TPZFlopCounter> Inv;
  REAL local_c8;
  TPZFMatrix<TPZFlopCounter> local_b8;
  
  local_b8.super_TPZMatrix<TPZFlopCounter>.super_TPZBaseMatrix.fRow = 0;
  local_b8.super_TPZMatrix<TPZFlopCounter>.super_TPZBaseMatrix.fCol = 0;
  local_b8.super_TPZMatrix<TPZFlopCounter>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_b8.super_TPZMatrix<TPZFlopCounter>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_b8.super_TPZMatrix<TPZFlopCounter>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01831ca0;
  local_b8.fElem = (TPZFlopCounter *)0x0;
  local_b8.fGiven = (TPZFlopCounter *)0x0;
  local_b8.fSize = 0;
  TPZVec<int>::TPZVec(&local_b8.fPivot.super_TPZVec<int>,0);
  local_b8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_b8.fPivot.super_TPZVec<int>.fStore = local_b8.fPivot.fExtAlloc;
  local_b8.fPivot.super_TPZVec<int>.fNElements = 0;
  local_b8.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_b8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183a7a8;
  local_b8.fWork.fStore = (TPZFlopCounter *)0x0;
  local_b8.fWork.fNElements = 0;
  local_b8.fWork.fNAlloc = 0;
  TVar1 = MatrixNorm(this,p,numiter,tol);
  iVar3 = Inverse(this,&local_b8,ENoDecompose);
  if (iVar3 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "TVar TPZMatrix<TPZFlopCounter>::ConditionNumber(int, int64_t, REAL) [T = TPZFlopCounter]"
               ,0x58);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," - it was not possible to compute the inverse matrix.",0x35);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    local_c8 = 0.0;
    std::ostream::flush();
  }
  else {
    TVar2 = MatrixNorm(&local_b8.super_TPZMatrix<TPZFlopCounter>,p,numiter,tol);
    local_c8 = TVar1.fVal * TVar2.fVal;
    TPZFlopCounter::gCount.fCount[1] = TPZFlopCounter::gCount.fCount[1] + 1;
  }
  TPZFMatrix<TPZFlopCounter>::~TPZFMatrix(&local_b8);
  return (TPZFlopCounter)local_c8;
}

Assistant:

TVar TPZMatrix<TVar>::ConditionNumber(int p, int64_t numiter, REAL tol){
	int64_t localnumiter = numiter;
	REAL localtol = tol;
	TPZFMatrix<TVar> Inv;
	TVar thisnorm = this->MatrixNorm(p, localnumiter, localtol);
	if (!this->Inverse(Inv,ENoDecompose)){
		PZError << __PRETTY_FUNCTION__ << " - it was not possible to compute the inverse matrix." << std:: endl;
		return 0.;
	}
	TVar invnorm = Inv.MatrixNorm(p, numiter, tol);
	return thisnorm * invnorm;
}